

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtree.c
# Opt level: O0

IceTImage icetVtreeCompose(void)

{
  bool bVar1;
  IceTSizeType num_bytes;
  int iVar2;
  IceTInt *pIVar3;
  IceTVoid *inSparseImageBuffer_00;
  IceTSparseImage outSparseImage_00;
  node_info *info_00;
  IceTBoolean *params;
  node_info *pnVar4;
  IceTInt display_tile_height;
  IceTInt display_tile_width;
  IceTInt *display_tile_viewport;
  node_info *recv_info;
  int recv_node;
  int local_80;
  int tile_held;
  int tiles_transfered;
  int node;
  int tile;
  node_info *my_info;
  node_info *info;
  IceTSizeType sparseImageSize;
  IceTSparseImage outSparseImage;
  IceTVoid *inSparseImageBuffer;
  IceTInt *tile_viewports;
  IceTBoolean *all_contained_tmasks;
  IceTInt *pIStack_30;
  IceTInt tile_displayed;
  IceTInt *display_nodes;
  IceTSizeType local_20;
  IceTInt max_height;
  IceTInt max_width;
  IceTInt num_tiles;
  IceTInt num_proc;
  IceTInt rank;
  IceTImage image;
  
  icetGetIntegerv(2,&num_tiles);
  icetGetIntegerv(3,&max_width);
  icetGetIntegerv(0x10,&max_height);
  icetGetIntegerv(0x13,&local_20);
  icetGetIntegerv(0x14,(IceTInt *)((long)&display_nodes + 4));
  pIStack_30 = icetUnsafeStateGetInteger(0x1a);
  pIVar3 = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x1b,(IceTInt *)((long)&all_contained_tmasks + 4));
  num_bytes = icetSparseImageBufferSize(local_20,display_nodes._4_4_);
  _num_proc = icetGetStateBufferImage(0x1a0,local_20,display_nodes._4_4_);
  inSparseImageBuffer_00 = icetGetStateBuffer(0x1a1,num_bytes);
  outSparseImage_00 = icetGetStateBufferSparseImage(0x1a2,local_20,display_nodes._4_4_);
  info_00 = (node_info *)icetGetStateBuffer(0x1a3,max_width * 0x1c);
  params = (IceTBoolean *)icetGetStateBuffer(0x1a4,max_width * max_height);
  icetGetBooleanv(0x89,params);
  for (tile_held = 0; tile_held < max_width; tile_held = tile_held + 1) {
    info_00[tile_held].rank = tile_held;
    info_00[tile_held].tile_held = -1;
    info_00[tile_held].num_contained = 0;
    for (tiles_transfered = 0; tiles_transfered < max_height;
        tiles_transfered = tiles_transfered + 1) {
      if (params[tile_held * max_height + tiles_transfered] != '\0') {
        info_00[tile_held].num_contained = info_00[tile_held].num_contained + 1;
      }
    }
  }
  local_80 = -1;
  do {
    bVar1 = false;
    sort_by_contained(info_00,max_width);
    for (tile_held = 0; tile_held < max_width; tile_held = tile_held + 1) {
      info_00[tile_held].tile_sending = -1;
      info_00[tile_held].tile_receiving = -1;
    }
    for (recv_info._4_4_ = 0; recv_info._4_4_ < max_width; recv_info._4_4_ = recv_info._4_4_ + 1) {
      pnVar4 = info_00 + recv_info._4_4_;
      if (pnVar4->tile_receiving < 0) {
        if (pnVar4->tile_held < 0) {
LAB_001215ee:
          for (tiles_transfered = 0; tiles_transfered < max_height;
              tiles_transfered = tiles_transfered + 1) {
            if (((params[info_00[recv_info._4_4_].rank * max_height + tiles_transfered] != '\0') ||
                (pIStack_30[tiles_transfered] == pnVar4->rank)) &&
               ((pnVar4->tile_sending != tiles_transfered &&
                (iVar2 = find_sender(info_00,max_width,recv_info._4_4_,tiles_transfered,
                                     pIStack_30[tiles_transfered],max_height,params), iVar2 != 0))))
            {
              bVar1 = true;
              break;
            }
          }
        }
        else {
          iVar2 = find_sender(info_00,max_width,recv_info._4_4_,pnVar4->tile_held,
                              pIStack_30[pnVar4->tile_held],max_height,params);
          if (iVar2 == 0) {
            if (((pnVar4->tile_sending < 0) && (pnVar4->rank != pIStack_30[pnVar4->tile_held])) &&
               (iVar2 = find_receiver(info_00,max_width,recv_info._4_4_,pnVar4->tile_held,
                                      pIStack_30[pnVar4->tile_held],max_height,params), iVar2 != 0))
            {
              bVar1 = true;
              goto LAB_001215ee;
            }
          }
          else {
            bVar1 = true;
          }
        }
      }
    }
    _node = (node_info *)0x0;
    for (tile_held = 0; tile_held < max_width; tile_held = tile_held + 1) {
      if (info_00[tile_held].rank == num_tiles) {
        _node = info_00 + tile_held;
        break;
      }
    }
    do_send_receive(_node,local_80,max_height,params,_num_proc,inSparseImageBuffer_00,num_bytes,
                    outSparseImage_00);
    local_80 = _node->tile_held;
  } while (bVar1);
  for (tile_held = 0; tile_held < max_width; tile_held = tile_held + 1) {
    if (info_00[tile_held].rank == num_tiles) {
      _node = info_00 + tile_held;
      break;
    }
  }
  _node->tile_receiving = -1;
  _node->tile_sending = -1;
  if ((-1 < _node->tile_held) && (_node->tile_held != all_contained_tmasks._4_4_)) {
    _node->tile_sending = _node->tile_held;
    _node->send_dest = pIStack_30[_node->tile_held];
    _node->tile_held = -1;
  }
  if ((_node->tile_held != all_contained_tmasks._4_4_) && (-1 < all_contained_tmasks._4_4_)) {
    for (tile_held = 0; tile_held < max_width; tile_held = tile_held + 1) {
      if (info_00[tile_held].tile_held == all_contained_tmasks._4_4_) {
        _node->tile_receiving = all_contained_tmasks._4_4_;
        _node->recv_src = info_00[tile_held].rank;
        _node->tile_held = all_contained_tmasks._4_4_;
        break;
      }
    }
  }
  do_send_receive(_node,local_80,max_height,params,_num_proc,inSparseImageBuffer_00,num_bytes,
                  outSparseImage_00);
  if ((-1 < all_contained_tmasks._4_4_) && (all_contained_tmasks._4_4_ != _node->tile_held)) {
    if (params[num_tiles * max_height + all_contained_tmasks._4_4_] == '\0') {
      icetImageSetDimensions
                (_num_proc,pIVar3[(long)(all_contained_tmasks._4_4_ << 2) + 2],
                 pIVar3[(long)(all_contained_tmasks._4_4_ << 2) + 3]);
      icetClearImage(_num_proc);
    }
    else {
      icetGetTileImage(all_contained_tmasks._4_4_,_num_proc);
    }
  }
  return (IceTImage)_num_proc;
}

Assistant:

IceTImage icetVtreeCompose(void)
{
    IceTInt rank, num_proc;
    IceTInt num_tiles;
    IceTInt max_width, max_height;
    const IceTInt *display_nodes;
    IceTInt tile_displayed;
    IceTBoolean *all_contained_tmasks;
    const IceTInt *tile_viewports;
    IceTImage image;
    IceTVoid *inSparseImageBuffer;
    IceTSparseImage outSparseImage;
    IceTSizeType sparseImageSize;
    struct node_info *info;
    struct node_info *my_info;
    int tile, node;
    int tiles_transfered;
    int tile_held = -1;

    icetRaiseDebug("In vtreeCompose");

  /* Get state. */
    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);

  /* Allocate buffers. */
    sparseImageSize = icetSparseImageBufferSize(max_width, max_height);

    image                = icetGetStateBufferImage(VTREE_IMAGE_BUFFER,
                                                   max_width, max_height);
    inSparseImageBuffer  = icetGetStateBuffer(VTREE_IN_SPARSE_IMAGE_BUFFER,
                                              sparseImageSize);
    outSparseImage       = icetGetStateBufferSparseImage(
                                                  VTREE_OUT_SPARSE_IMAGE_BUFFER,
                                                  max_width, max_height);
    info                 = icetGetStateBuffer(VTREE_INFO_BUFFER,
                                             sizeof(struct node_info)*num_proc);
    all_contained_tmasks = icetGetStateBuffer(VTREE_ALL_CONTAINED_TMASKS_BUFFER,
                                        sizeof(IceTBoolean)*num_proc*num_tiles);

    icetGetBooleanv(ICET_ALL_CONTAINED_TILES_MASKS, all_contained_tmasks);
    
  /* Initialize info array. */
    for (node = 0; node < num_proc; node++) {
        info[node].rank = node;
        info[node].tile_held = -1;        /* Id of tile image held in memory. */
        info[node].num_contained = 0;        /* # of images to be rendered. */
        for (tile = 0; tile < num_tiles; tile++) {
            if (all_contained_tmasks[node*num_tiles + tile]) {
                info[node].num_contained++;
            }
        }
    }

#define CONTAINS_TILE(nodei, tile)                                \
    (all_contained_tmasks[info[nodei].rank*num_tiles+(tile)])

    tile_held = -1;
    do {
        int recv_node;

        tiles_transfered = 0;
        sort_by_contained(info, num_proc);
        for (node = 0; node < num_proc; node++) {
            info[node].tile_sending = -1;
            info[node].tile_receiving = -1;
        }

        for (recv_node = 0; recv_node < num_proc; recv_node++) {
            struct node_info *recv_info = info + recv_node;

            if (recv_info->tile_receiving >= 0) continue;

            if (recv_info->tile_held >= 0) {
              /* This node is holding a tile.  It must either send or
                 receive this tile. */
                if (find_sender(info, num_proc, recv_node, recv_info->tile_held,
                                display_nodes[recv_info->tile_held],
                                num_tiles, all_contained_tmasks)) {
                    tiles_transfered = 1;
                    continue;
                }

              /* Could not find a match for a sender, how about someone who
                 can receive it? */
                if (   (recv_info->tile_sending < 0)
                    && (recv_info->rank != display_nodes[recv_info->tile_held])
                    && find_receiver(info, num_proc, recv_node,
                                     recv_info->tile_held,
                                     display_nodes[recv_info->tile_held],
                                     num_tiles, all_contained_tmasks) ) {
                    tiles_transfered = 1;
                } else {
                  /* Could not send or receive.  Give up. */
                    continue;
                }
            }

          /* OK.  Let's try to receive any tile that we still have. */
            for (tile = 0; tile < num_tiles; tile++) {
                if (   (   !CONTAINS_TILE(recv_node, tile)
                        && (display_nodes[tile] != recv_info->rank) )
                    || (recv_info->tile_sending == tile) ) continue;
                if (find_sender(info, num_proc, recv_node, tile,
                                display_nodes[tile], num_tiles,
                                all_contained_tmasks)) {
                    tiles_transfered = 1;
                    break;
                }
            }
        }

      /* Now that we figured out who is sending to who, do the actual
         send and receive. */
        my_info = NULL;
        for (node = 0; node < num_proc; node++) {
            if (info[node].rank == rank) {
                my_info = info + node;
                break;
            }
        }

        do_send_receive(my_info, tile_held, num_tiles,
                        all_contained_tmasks,
                        image, inSparseImageBuffer, sparseImageSize,
                        outSparseImage);

        tile_held = my_info->tile_held;

    } while (tiles_transfered);

  /* It's possible that a composited image ended up on a processor that        */
  /* is not the display node for that image.  Do one last round of        */
  /* transfers to make sure all the tiles ended up in the right place.        */
    for (node = 0; node < num_proc; node++) {
        if (info[node].rank == rank) {
            my_info = info + node;
            break;
        }
    }
    my_info->tile_receiving = -1;
    my_info->tile_sending = -1;
    if ((my_info->tile_held >= 0) && (my_info->tile_held != tile_displayed)) {
      /* I'm holding an image that does not belong to me.  Ship it off. */
        my_info->tile_sending = my_info->tile_held;
        my_info->send_dest = display_nodes[my_info->tile_held];
        my_info->tile_held = -1;
    }
    if ((my_info->tile_held != tile_displayed) && (tile_displayed >= 0)) {
      /* Someone may be holding an image that belongs to me.  Check. */
        for (node = 0; node < num_proc; node++) {
            if (info[node].tile_held == tile_displayed) {
                my_info->tile_receiving = tile_displayed;
                my_info->recv_src = info[node].rank;
                my_info->tile_held = tile_displayed;
                break;
            }
        }
    }
    do_send_receive(my_info, tile_held,
                    num_tiles, all_contained_tmasks,
                    image, inSparseImageBuffer, sparseImageSize,
                    outSparseImage);
    tile_held = my_info->tile_held;

  /* Hacks for when "this" tile was not rendered. */
    if ((tile_displayed >= 0) && (tile_displayed != tile_held)) {
        if (all_contained_tmasks[rank*num_tiles + tile_displayed]) {
          /* Only "this" node draws "this" tile.  Because the image never */
          /* needed to be transferred, it was never rendered above.  Just */
          /* render it now.                                                  */
            icetRaiseDebug("Rendering tile to display.");
          /* This may uncessarily read a buffer if not outputing an input
             buffer */
            icetGetTileImage(tile_displayed, image);
        } else {
          /* "This" tile is blank. */
            const IceTInt *display_tile_viewport
                = tile_viewports + 4*tile_displayed;
            IceTInt display_tile_width = display_tile_viewport[2];
            IceTInt display_tile_height = display_tile_viewport[3];

            icetRaiseDebug("Returning blank image.");
            icetImageSetDimensions(
                                image, display_tile_width, display_tile_height);
            icetClearImage(image);
        }
    }

    return image;
}